

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UnicodeSetStringSpan::spanUTF8
          (UnicodeSetStringSpan *this,uint8_t *s,int32_t length,USetSpanCondition spanCondition)

{
  int iVar1;
  UBool UVar2;
  int32_t iVar3;
  int32_t iVar4;
  int local_a8;
  int32_t minOffset;
  int32_t inc_1;
  int32_t overlap_1;
  int32_t maxOverlap;
  int32_t maxInc;
  uint local_90;
  int32_t inc;
  int32_t overlap;
  int32_t length8;
  uint8_t *s8;
  uint8_t *spanUTF8Lengths;
  int local_70;
  int32_t stringsLength;
  int32_t i;
  int32_t rest;
  int32_t pos;
  undefined1 local_58 [8];
  OffsetList offsets;
  int32_t spanLength;
  USetSpanCondition spanCondition_local;
  int32_t length_local;
  uint8_t *s_local;
  UnicodeSetStringSpan *this_local;
  
  if (spanCondition == USET_SPAN_NOT_CONTAINED) {
    this_local._4_4_ = spanNotUTF8(this,s,length);
  }
  else {
    offsets._36_4_ = UnicodeSet::spanUTF8(&this->spanSet,(char *)s,length,USET_SPAN_CONTAINED);
    this_local._4_4_ = length;
    if (offsets._36_4_ != length) {
      OffsetList::OffsetList((OffsetList *)local_58);
      if (spanCondition == USET_SPAN_CONTAINED) {
        OffsetList::setMaxLength((OffsetList *)local_58,this->maxLength8);
      }
      i = offsets._36_4_;
      stringsLength = length - offsets._36_4_;
      iVar3 = UVector::size(this->strings);
      s8 = this->spanLengths;
      if (this->all != '\0') {
        s8 = s8 + (iVar3 << 1);
      }
LAB_001efe89:
      while (_overlap = this->utf8, spanCondition != USET_SPAN_CONTAINED) {
        overlap_1 = 0;
        inc_1 = 0;
        for (local_70 = 0; local_70 < iVar3; local_70 = local_70 + 1) {
          iVar1 = this->utf8Lengths[local_70];
          if (iVar1 != 0) {
            minOffset = (uint)s8[local_70];
            if (0xfd < s8[local_70]) {
              minOffset = iVar1;
            }
            if ((int)offsets._36_4_ < minOffset) {
              minOffset = offsets._36_4_;
            }
            local_a8 = iVar1 - minOffset;
            while( true ) {
              if ((stringsLength < local_a8) || (minOffset < inc_1)) goto LAB_001f0208;
              if (((-0x41 < (char)s[i - minOffset]) &&
                  ((inc_1 < minOffset || (overlap_1 < local_a8)))) &&
                 (UVar2 = matches8(s + ((long)i - (long)minOffset),_overlap,iVar1), UVar2 != '\0'))
              break;
              minOffset = minOffset + -1;
              local_a8 = local_a8 + 1;
            }
            overlap_1 = local_a8;
            inc_1 = minOffset;
LAB_001f0208:
            _overlap = _overlap + iVar1;
          }
        }
        if ((overlap_1 == 0) && (inc_1 == 0)) goto LAB_001f027f;
        i = overlap_1 + i;
        stringsLength = stringsLength - overlap_1;
        if (stringsLength == 0) goto LAB_001f0414;
        offsets._36_4_ = 0;
      }
      for (local_70 = 0; local_70 < iVar3; local_70 = local_70 + 1) {
        iVar1 = this->utf8Lengths[local_70];
        if (iVar1 != 0) {
          local_90 = (uint)s8[local_70];
          if (local_90 == 0xff) {
            _overlap = _overlap + iVar1;
          }
          else {
            if ((0xfd < local_90) && (local_90 = iVar1 - 1, (char)_overlap[(int)local_90] < -0x40))
            {
              local_90 = utf8_back1SafeBody_63(_overlap,0,local_90);
            }
            if ((int)offsets._36_4_ < (int)local_90) {
              local_90 = offsets._36_4_;
            }
            for (maxInc = iVar1 - local_90; maxInc <= stringsLength; maxInc = maxInc + 1) {
              if (((-0x41 < (char)s[(int)(i - local_90)]) &&
                  (UVar2 = OffsetList::containsOffset((OffsetList *)local_58,maxInc), UVar2 == '\0')
                  ) && (UVar2 = matches8(s + ((long)i - (long)(int)local_90),_overlap,iVar1),
                       UVar2 != '\0')) {
                if (maxInc == stringsLength) goto LAB_001f0414;
                OffsetList::addOffset((OffsetList *)local_58,maxInc);
              }
              if (local_90 == 0) break;
              local_90 = local_90 - 1;
            }
            _overlap = _overlap + iVar1;
          }
        }
      }
LAB_001f027f:
      if ((offsets._36_4_ == 0) && (i != 0)) {
        UVar2 = OffsetList::isEmpty((OffsetList *)local_58);
        if (UVar2 != '\0') {
          offsets._36_4_ =
               UnicodeSet::spanUTF8
                         (&this->spanSet,(char *)(s + i),stringsLength,USET_SPAN_CONTAINED);
          if ((offsets._36_4_ == stringsLength) || (offsets._36_4_ == 0)) {
            this_local._4_4_ = i + offsets._36_4_;
LAB_001f0414:
            OffsetList::~OffsetList((OffsetList *)local_58);
            return this_local._4_4_;
          }
          i = offsets._36_4_ + i;
          stringsLength = stringsLength - offsets._36_4_;
          goto LAB_001efe89;
        }
        offsets._36_4_ = spanOneUTF8(&this->spanSet,s + i,stringsLength);
        if (0 < (int)offsets._36_4_) {
          if (offsets._36_4_ == stringsLength) goto LAB_001f0414;
          i = i + offsets._36_4_;
          stringsLength = stringsLength - offsets._36_4_;
          OffsetList::shift((OffsetList *)local_58,offsets._36_4_);
          offsets._36_4_ = 0;
          goto LAB_001efe89;
        }
      }
      else {
        UVar2 = OffsetList::isEmpty((OffsetList *)local_58);
        if (UVar2 != '\0') {
          this_local._4_4_ = i;
          goto LAB_001f0414;
        }
      }
      iVar4 = OffsetList::popMinimum((OffsetList *)local_58);
      i = iVar4 + i;
      stringsLength = stringsLength - iVar4;
      offsets._36_4_ = 0;
      goto LAB_001efe89;
    }
  }
  return this_local._4_4_;
}

Assistant:

int32_t UnicodeSetStringSpan::spanUTF8(const uint8_t *s, int32_t length, USetSpanCondition spanCondition) const {
    if(spanCondition==USET_SPAN_NOT_CONTAINED) {
        return spanNotUTF8(s, length);
    }
    int32_t spanLength=spanSet.spanUTF8((const char *)s, length, USET_SPAN_CONTAINED);
    if(spanLength==length) {
        return length;
    }

    // Consider strings; they may overlap with the span.
    OffsetList offsets;
    if(spanCondition==USET_SPAN_CONTAINED) {
        // Use offset list to try all possibilities.
        offsets.setMaxLength(maxLength8);
    }
    int32_t pos=spanLength, rest=length-pos;
    int32_t i, stringsLength=strings.size();
    uint8_t *spanUTF8Lengths=spanLengths;
    if(all) {
        spanUTF8Lengths+=2*stringsLength;
    }
    for(;;) {
        const uint8_t *s8=utf8;
        int32_t length8;
        if(spanCondition==USET_SPAN_CONTAINED) {
            for(i=0; i<stringsLength; ++i) {
                length8=utf8Lengths[i];
                if(length8==0) {
                    continue;  // String not representable in UTF-8.
                }
                int32_t overlap=spanUTF8Lengths[i];
                if(overlap==ALL_CP_CONTAINED) {
                    s8+=length8;
                    continue;  // Irrelevant string.
                }

                // Try to match this string at pos-overlap..pos.
                if(overlap>=LONG_SPAN) {
                    overlap=length8;
                    // While contained: No point matching fully inside the code point span.
                    U8_BACK_1(s8, 0, overlap);  // Length of the string minus the last code point.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t inc=length8-overlap;  // Keep overlap+inc==length8.
                for(;;) {
                    if(inc>rest) {
                        break;
                    }
                    // Try to match if the increment is not listed already.
                    // Match at code point boundaries. (The UTF-8 strings were converted
                    // from UTF-16 and are guaranteed to be well-formed.)
                    if(!U8_IS_TRAIL(s[pos-overlap]) &&
                            !offsets.containsOffset(inc) &&
                            matches8(s+pos-overlap, s8, length8)) {
                        if(inc==rest) {
                            return length;  // Reached the end of the string.
                        }
                        offsets.addOffset(inc);
                    }
                    if(overlap==0) {
                        break;
                    }
                    --overlap;
                    ++inc;
                }
                s8+=length8;
            }
        } else /* USET_SPAN_SIMPLE */ {
            int32_t maxInc=0, maxOverlap=0;
            for(i=0; i<stringsLength; ++i) {
                length8=utf8Lengths[i];
                if(length8==0) {
                    continue;  // String not representable in UTF-8.
                }
                int32_t overlap=spanUTF8Lengths[i];
                // For longest match, we do need to try to match even an all-contained string
                // to find the match from the earliest start.

                // Try to match this string at pos-overlap..pos.
                if(overlap>=LONG_SPAN) {
                    overlap=length8;
                    // Longest match: Need to match fully inside the code point span
                    // to find the match from the earliest start.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t inc=length8-overlap;  // Keep overlap+inc==length8.
                for(;;) {
                    if(inc>rest || overlap<maxOverlap) {
                        break;
                    }
                    // Try to match if the string is longer or starts earlier.
                    // Match at code point boundaries. (The UTF-8 strings were converted
                    // from UTF-16 and are guaranteed to be well-formed.)
                    if(!U8_IS_TRAIL(s[pos-overlap]) &&
                            (overlap>maxOverlap ||
                                /* redundant overlap==maxOverlap && */ inc>maxInc) &&
                            matches8(s+pos-overlap, s8, length8)) {
                        maxInc=inc;  // Longest match from earliest start.
                        maxOverlap=overlap;
                        break;
                    }
                    --overlap;
                    ++inc;
                }
                s8+=length8;
            }

            if(maxInc!=0 || maxOverlap!=0) {
                // Longest-match algorithm, and there was a string match.
                // Simply continue after it.
                pos+=maxInc;
                rest-=maxInc;
                if(rest==0) {
                    return length;  // Reached the end of the string.
                }
                spanLength=0;  // Match strings from after a string match.
                continue;
            }
        }
        // Finished trying to match all strings at pos.

        if(spanLength!=0 || pos==0) {
            // The position is after an unlimited code point span (spanLength!=0),
            // not after a string match.
            // The only position where spanLength==0 after a span is pos==0.
            // Otherwise, an unlimited code point span is only tried again when no
            // strings match, and if such a non-initial span fails we stop.
            if(offsets.isEmpty()) {
                return pos;  // No strings matched after a span.
            }
            // Match strings from after the next string match.
        } else {
            // The position is after a string match (or a single code point).
            if(offsets.isEmpty()) {
                // No more strings matched after a previous string match.
                // Try another code point span from after the last string match.
                spanLength=spanSet.spanUTF8((const char *)s+pos, rest, USET_SPAN_CONTAINED);
                if( spanLength==rest || // Reached the end of the string, or
                    spanLength==0       // neither strings nor span progressed.
                ) {
                    return pos+spanLength;
                }
                pos+=spanLength;
                rest-=spanLength;
                continue;  // spanLength>0: Match strings from after a span.
            } else {
                // Try to match only one code point from after a string match if some
                // string matched beyond it, so that we try all possible positions
                // and don't overshoot.
                spanLength=spanOneUTF8(spanSet, s+pos, rest);
                if(spanLength>0) {
                    if(spanLength==rest) {
                        return length;  // Reached the end of the string.
                    }
                    // Match strings after this code point.
                    // There cannot be any increments below it because UnicodeSet strings
                    // contain multiple code points.
                    pos+=spanLength;
                    rest-=spanLength;
                    offsets.shift(spanLength);
                    spanLength=0;
                    continue;  // Match strings from after a single code point.
                }
                // Match strings from after the next string match.
            }
        }
        int32_t minOffset=offsets.popMinimum();
        pos+=minOffset;
        rest-=minOffset;
        spanLength=0;  // Match strings from after a string match.
    }
}